

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegFreeRegexp(xmlRegexpPtr regexp)

{
  int local_14;
  int i;
  xmlRegexpPtr regexp_local;
  
  if (regexp != (xmlRegexpPtr)0x0) {
    if (regexp->string != (xmlChar *)0x0) {
      (*xmlFree)(regexp->string);
    }
    if (regexp->states != (xmlRegStatePtr *)0x0) {
      for (local_14 = 0; local_14 < regexp->nbStates; local_14 = local_14 + 1) {
        xmlRegFreeState(regexp->states[local_14]);
      }
      (*xmlFree)(regexp->states);
    }
    if (regexp->atoms != (xmlRegAtomPtr *)0x0) {
      for (local_14 = 0; local_14 < regexp->nbAtoms; local_14 = local_14 + 1) {
        xmlRegFreeAtom(regexp->atoms[local_14]);
      }
      (*xmlFree)(regexp->atoms);
    }
    if (regexp->counters != (xmlRegCounter *)0x0) {
      (*xmlFree)(regexp->counters);
    }
    if (regexp->compact != (int *)0x0) {
      (*xmlFree)(regexp->compact);
    }
    if (regexp->transdata != (void **)0x0) {
      (*xmlFree)(regexp->transdata);
    }
    if (regexp->stringMap != (xmlChar **)0x0) {
      for (local_14 = 0; local_14 < regexp->nbstrings; local_14 = local_14 + 1) {
        (*xmlFree)(regexp->stringMap[local_14]);
      }
      (*xmlFree)(regexp->stringMap);
    }
    (*xmlFree)(regexp);
  }
  return;
}

Assistant:

void
xmlRegFreeRegexp(xmlRegexpPtr regexp) {
    int i;
    if (regexp == NULL)
	return;

    if (regexp->string != NULL)
	xmlFree(regexp->string);
    if (regexp->states != NULL) {
	for (i = 0;i < regexp->nbStates;i++)
	    xmlRegFreeState(regexp->states[i]);
	xmlFree(regexp->states);
    }
    if (regexp->atoms != NULL) {
	for (i = 0;i < regexp->nbAtoms;i++)
	    xmlRegFreeAtom(regexp->atoms[i]);
	xmlFree(regexp->atoms);
    }
    if (regexp->counters != NULL)
	xmlFree(regexp->counters);
    if (regexp->compact != NULL)
	xmlFree(regexp->compact);
    if (regexp->transdata != NULL)
	xmlFree(regexp->transdata);
    if (regexp->stringMap != NULL) {
	for (i = 0; i < regexp->nbstrings;i++)
	    xmlFree(regexp->stringMap[i]);
	xmlFree(regexp->stringMap);
    }

    xmlFree(regexp);
}